

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

void uv__udp_sendmmsg(uv_udp_t *handle)

{
  int iVar1;
  uint *__s;
  ulong uVar2;
  int *piVar3;
  bool bVar4;
  ulong local_540;
  size_t i;
  size_t pkts;
  ssize_t npkts;
  QUEUE *q;
  uv__mmsghdr *p;
  uv__mmsghdr h [20];
  uv_udp_send_t *req;
  uv_udp_t *handle_local;
  
  if (handle->write_queue != (void **)handle->write_queue[0]) {
    do {
      i = 0;
      npkts = (ssize_t)handle->write_queue[0];
      for (; i < 0x14 && (void **)npkts != handle->write_queue; i = i + 1) {
        if (npkts == 0) {
          __assert_fail("q != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                        ,0x151,"void uv__udp_sendmmsg(uv_udp_t *)");
        }
        h[0x13]._56_8_ = npkts + -0x50;
        if (h[0x13]._56_8_ == 0) {
          __assert_fail("req != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                        ,0x153,"void uv__udp_sendmmsg(uv_udp_t *)");
        }
        __s = &h[i - 1].msg_len;
        memset(__s,0,0x40);
        if (*(short *)(h[0x13]._56_8_ + 0x60) == 0) {
          *(undefined8 *)__s = 0;
          *(undefined4 *)&h[i].msg_hdr.msg_name = 0;
        }
        else {
          *(long *)__s = h[0x13]._56_8_ + 0x60;
          if (*(short *)(h[0x13]._56_8_ + 0x60) == 10) {
            *(undefined4 *)&h[i].msg_hdr.msg_name = 0x1c;
          }
          else if (*(short *)(h[0x13]._56_8_ + 0x60) == 2) {
            *(undefined4 *)&h[i].msg_hdr.msg_name = 0x10;
          }
          else {
            if (*(short *)(h[0x13]._56_8_ + 0x60) != 1) {
              __assert_fail("0 && \"unsupported address family\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                            ,0x163,"void uv__udp_sendmmsg(uv_udp_t *)");
            }
            *(undefined4 *)&h[i].msg_hdr.msg_name = 0x6e;
          }
        }
        *(undefined8 *)&h[i].msg_hdr.msg_namelen = *(undefined8 *)(h[0x13]._56_8_ + 0xe8);
        h[i].msg_hdr.msg_iov = (iovec *)(ulong)*(uint *)(h[0x13]._56_8_ + 0xe0);
        npkts = *(ssize_t *)npkts;
      }
      do {
        iVar1 = uv__sendmmsg((handle->io_watcher).fd,(uv__mmsghdr *)&p,(uint)i);
        uVar2 = (ulong)iVar1;
        bVar4 = false;
        if (uVar2 == 0xffffffffffffffff) {
          piVar3 = __errno_location();
          bVar4 = *piVar3 == 4;
        }
      } while (bVar4);
      if ((long)uVar2 < 1) {
        piVar3 = __errno_location();
        if (*piVar3 == 0xb) {
          return;
        }
        piVar3 = __errno_location();
        if (*piVar3 == 0xb) {
          return;
        }
        piVar3 = __errno_location();
        if (*piVar3 == 0x69) {
          return;
        }
        local_540 = 0;
        npkts = (ssize_t)handle->write_queue[0];
        while( true ) {
          if (i <= local_540 || (void **)npkts == handle->write_queue) {
            uv__io_feed(handle->loop,&handle->io_watcher);
            return;
          }
          if (npkts == 0) break;
          h[0x13]._56_8_ = npkts + -0x50;
          if (h[0x13]._56_8_ == 0) {
            __assert_fail("req != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                          ,0x177,"void uv__udp_sendmmsg(uv_udp_t *)");
          }
          piVar3 = __errno_location();
          *(long *)(h[0x13]._56_8_ + 0xf0) = (long)-*piVar3;
          **(undefined8 **)(h[0x13]._56_8_ + 0x58) = *(undefined8 *)(h[0x13]._56_8_ + 0x50);
          *(undefined8 *)(*(long *)(h[0x13]._56_8_ + 0x50) + 8) =
               *(undefined8 *)(h[0x13]._56_8_ + 0x58);
          *(void ***)(h[0x13]._56_8_ + 0x50) = handle->write_completed_queue;
          *(void **)(h[0x13]._56_8_ + 0x58) = handle->write_completed_queue[1];
          **(long **)(h[0x13]._56_8_ + 0x58) = h[0x13]._56_8_ + 0x50;
          handle->write_completed_queue[1] = (void *)(h[0x13]._56_8_ + 0x50);
          local_540 = local_540 + 1;
          npkts = (ssize_t)handle->write_queue[0];
        }
        __assert_fail("q != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                      ,0x175,"void uv__udp_sendmmsg(uv_udp_t *)");
      }
      local_540 = 0;
      npkts = (ssize_t)handle->write_queue[0];
      for (; local_540 < uVar2 && (void **)npkts != handle->write_queue; local_540 = local_540 + 1)
      {
        if (npkts == 0) {
          __assert_fail("q != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                        ,0x187,"void uv__udp_sendmmsg(uv_udp_t *)");
        }
        h[0x13]._56_8_ = npkts + -0x50;
        if (h[0x13]._56_8_ == 0) {
          __assert_fail("req != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmlibuv/src/unix/udp.c"
                        ,0x189,"void uv__udp_sendmmsg(uv_udp_t *)");
        }
        *(undefined8 *)(npkts + 0xa0) = *(undefined8 *)(*(long *)(npkts + 0x98) + 8);
        **(undefined8 **)(npkts + 8) = *(undefined8 *)npkts;
        *(undefined8 *)(*(long *)npkts + 8) = *(undefined8 *)(npkts + 8);
        *(void ***)npkts = handle->write_completed_queue;
        *(void **)(npkts + 8) = handle->write_completed_queue[1];
        **(ssize_t **)(npkts + 8) = npkts;
        handle->write_completed_queue[1] = (void *)npkts;
        npkts = (ssize_t)handle->write_queue[0];
      }
    } while (handle->write_queue != (void **)handle->write_queue[0]);
    uv__io_feed(handle->loop,&handle->io_watcher);
  }
  return;
}

Assistant:

static void uv__udp_sendmmsg(uv_udp_t* handle) {
  uv_udp_send_t* req;
  struct uv__mmsghdr h[UV__MMSG_MAXWIDTH];
  struct uv__mmsghdr *p;
  QUEUE* q;
  ssize_t npkts;
  size_t pkts;
  size_t i;

  if (QUEUE_EMPTY(&handle->write_queue))
    return;

write_queue_drain:
  for (pkts = 0, q = QUEUE_HEAD(&handle->write_queue);
       pkts < UV__MMSG_MAXWIDTH && q != &handle->write_queue;
       ++pkts, q = QUEUE_HEAD(q)) {
    assert(q != NULL);
    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    p = &h[pkts];
    memset(p, 0, sizeof(*p));
    if (req->addr.ss_family == AF_UNSPEC) {
      p->msg_hdr.msg_name = NULL;
      p->msg_hdr.msg_namelen = 0;
    } else {
      p->msg_hdr.msg_name = &req->addr;
      if (req->addr.ss_family == AF_INET6)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_in6);
      else if (req->addr.ss_family == AF_INET)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_in);
      else if (req->addr.ss_family == AF_UNIX)
        p->msg_hdr.msg_namelen = sizeof(struct sockaddr_un);
      else {
        assert(0 && "unsupported address family");
        abort();
      }
    }
    h[pkts].msg_hdr.msg_iov = (struct iovec*) req->bufs;
    h[pkts].msg_hdr.msg_iovlen = req->nbufs;
  }

  do
    npkts = uv__sendmmsg(handle->io_watcher.fd, h, pkts);
  while (npkts == -1 && errno == EINTR);

  if (npkts < 1) {
    if (errno == EAGAIN || errno == EWOULDBLOCK || errno == ENOBUFS)
      return;
    for (i = 0, q = QUEUE_HEAD(&handle->write_queue);
         i < pkts && q != &handle->write_queue;
         ++i, q = QUEUE_HEAD(&handle->write_queue)) {
      assert(q != NULL);
      req = QUEUE_DATA(q, uv_udp_send_t, queue);
      assert(req != NULL);

      req->status = UV__ERR(errno);
      QUEUE_REMOVE(&req->queue);
      QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
    }
    uv__io_feed(handle->loop, &handle->io_watcher);
    return;
  }

  /* Safety: npkts known to be >0 below. Hence cast from ssize_t
   * to size_t safe.
   */
  for (i = 0, q = QUEUE_HEAD(&handle->write_queue);
       i < (size_t)npkts && q != &handle->write_queue;
       ++i, q = QUEUE_HEAD(&handle->write_queue)) {
    assert(q != NULL);
    req = QUEUE_DATA(q, uv_udp_send_t, queue);
    assert(req != NULL);

    req->status = req->bufs[0].len;

    /* Sending a datagram is an atomic operation: either all data
     * is written or nothing is (and EMSGSIZE is raised). That is
     * why we don't handle partial writes. Just pop the request
     * off the write queue and onto the completed queue, done.
     */
    QUEUE_REMOVE(&req->queue);
    QUEUE_INSERT_TAIL(&handle->write_completed_queue, &req->queue);
  }

  /* couldn't batch everything, continue sending (jump to avoid stack growth) */
  if (!QUEUE_EMPTY(&handle->write_queue))
    goto write_queue_drain;
  uv__io_feed(handle->loop, &handle->io_watcher);
  return;
}